

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismExtend.cpp
# Opt level: O3

int pztopology::Pr<pztopology::Pr<pztopology::TPZPoint>_>::ContainedSideLocId(int side,int c)

{
  int iVar1;
  int iVar2;
  ostream *this;
  long *plVar3;
  int side_00;
  
  side_00 = side % 3;
  iVar2 = 3;
  if (1 < side_00) {
    iVar2 = 9;
  }
  iVar1 = (uint)(1 < side_00) * 2 + 1;
  if (side < 6) {
    iVar2 = iVar1;
  }
  if (c < iVar2) {
    if (side + 2U < 5) {
      iVar2 = Pr<pztopology::TPZPoint>::ContainedSideLocId(side_00,c);
      return iVar2;
    }
    if (side - 3U < 3) {
      iVar2 = Pr<pztopology::TPZPoint>::ContainedSideLocId(side_00,c);
      iVar2 = iVar2 + 3;
    }
    else {
      iVar2 = Pr<pztopology::TPZPoint>::ContainedSideLocId(side_00,c % iVar1);
      iVar2 = (c / iVar1) * 3 + iVar2;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Pr<TFather>::ContainedSideLocId, side = ",0x28);
    this = (ostream *)std::ostream::operator<<(&std::cerr,side);
    std::__ostream_insert<char,std::char_traits<char>>(this," connect = ",0xb);
    plVar3 = (long *)std::ostream::operator<<(this,c);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int Pr<TFather>::ContainedSideLocId(int side,int c) {
		int nsconnect = NContainedSides(side);
		if(c >= nsconnect)
		{
			PZError << "Pr<TFather>::ContainedSideLocId, side = " << side << " connect = " << c << endl;
			return -1;
		}
		int ftns = side/TFather::NSides;
		int fatherside = side%TFather::NSides;
		if(ftns == 0) return TFather::ContainedSideLocId(fatherside,c);
		if(ftns == 1) return TFather::ContainedSideLocId(fatherside,c)+TFather::NSides;
		int nsideconfather = TFather::NContainedSides(fatherside);
		int confather = c%nsideconfather;
		int level = c/nsideconfather;
		return TFather::ContainedSideLocId(fatherside,confather)+level*TFather::NSides;
	}